

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

double tsbp::MemoryUsedByCurrentProcess(void)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  double dVar3;
  char line [128];
  int local_98;
  short local_94;
  
  __stream = fopen("/proc/self/status","r");
  do {
    pcVar2 = fgets((char *)&local_98,0x80,__stream);
    if (pcVar2 == (char *)0x0) {
      dVar3 = -1.0;
      goto LAB_0011f805;
    }
  } while (local_94 != 0x3a53 || local_98 != 0x53526d56);
  iVar1 = parseLine((char *)&local_98);
  dVar3 = (double)iVar1;
LAB_0011f805:
  fclose(__stream);
  return dVar3;
}

Assistant:

double MemoryUsedByCurrentProcess()
    {
        FILE* file = fopen("/proc/self/status", "r");
        int result = -1;
        char line[128];

        while (fgets(line, 128, file) != NULL){
            if (strncmp(line, "VmRSS:", 6) == 0){
                result = parseLine(line); // Note: this value is in KB!
                break;
            }
        }

        fclose(file);
        
        double physicalMemoryUsedByCurrentProcess = (double)result;

        return physicalMemoryUsedByCurrentProcess;
    }